

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

string * __thiscall FIX::Message::toXML(Message *this,string *str)

{
  ostream *poVar1;
  string *psVar2;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream stream;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar1 = std::operator<<(local_190,"<message>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"<header>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  toXMLFields_abi_cxx11_(&local_200,this,&(this->m_header).super_FieldMap,4);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"</header>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"<body>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  toXMLFields_abi_cxx11_(&local_1c0,this,&this->super_FieldMap,4);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"</body>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"<trailer>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  toXMLFields_abi_cxx11_(&local_1e0,this,&(this->m_trailer).super_FieldMap,4);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"</trailer>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"</message>");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringbuf::str();
  psVar2 = (string *)std::__cxx11::string::operator=((string *)str,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return psVar2;
}

Assistant:

std::string &Message::toXML(std::string &str) const {
  std::stringstream stream;
  stream << "<message>" << std::endl
         << std::setw(2) << " " << "<header>" << std::endl
         << toXMLFields(getHeader(), 4) << std::setw(2) << " " << "</header>" << std::endl
         << std::setw(2) << " " << "<body>" << std::endl
         << toXMLFields(*this, 4) << std::setw(2) << " " << "</body>" << std::endl
         << std::setw(2) << " " << "<trailer>" << std::endl
         << toXMLFields(getTrailer(), 4) << std::setw(2) << " " << "</trailer>" << std::endl
         << "</message>";

  return str = stream.str();
}